

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_distributions.cc
# Opt level: O2

void continuous_dist_test_integrate_pdf<trng::beta_dist<long_double>>(beta_dist<long_double> *d)

{
  undefined1 x [16];
  undefined1 x_00 [16];
  undefined1 x_01 [16];
  longdouble *extraout_RDX;
  __normal_iterator<long_double_*,_std::vector<long_double,_std::allocator<long_double>_>_> last;
  longdouble *extraout_RDX_00;
  int i;
  int iVar1;
  AssertionHandler *in_RSI;
  long lVar2;
  longdouble in_ST0;
  longdouble lVar3;
  longdouble lVar4;
  longdouble in_ST1;
  longdouble lVar5;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble lVar6;
  longdouble in_ST5;
  longdouble lVar7;
  undefined6 in_stack_fffffffffffffeb2;
  vector<long_double,_std::allocator<long_double>_> y;
  SourceLineInfo local_e8;
  longdouble local_d8;
  SourceLineInfo *local_c0;
  AssertionHandler catchAssertionHandler;
  BinaryExpr<const_long_double_&,_const_long_double_&> local_68;
  StringRef local_38;
  
  lVar4 = in_ST5;
  lVar6 = in_ST5;
  roundl();
  lVar2 = 0x100000;
  if ((long)ROUND(in_ST0) < 0x100000) {
    lVar2 = (long)ROUND(in_ST0);
  }
  x._10_6_ = in_stack_fffffffffffffeb2;
  x._0_10_ = _DAT_00261470;
  trng::beta_dist<long_double>::icdf
            ((result_type_conflict3 *)d,(beta_dist<long_double> *)in_RSI,(result_type_conflict3)x);
  x_00._10_6_ = in_stack_fffffffffffffeb2;
  x_00._0_10_ = _DAT_00261480;
  trng::beta_dist<long_double>::icdf
            ((result_type_conflict3 *)d,(beta_dist<long_double> *)in_RSI,(result_type_conflict3)x_00
            );
  lVar3 = (longdouble)(int)lVar2;
  lVar5 = (in_ST2 - in_ST1) / lVar3;
  y.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  y.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  y.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  last._M_current = extraout_RDX;
  lVar7 = lVar6;
  for (iVar1 = 0; iVar1 <= (int)lVar2; iVar1 = iVar1 + 1) {
    x_01._10_6_ = in_stack_fffffffffffffeb2;
    x_01._0_10_ = in_ST1 + lVar5 * (longdouble)iVar1;
    in_ST3 = in_ST4;
    in_ST4 = in_ST5;
    in_ST5 = lVar4;
    lVar4 = lVar6;
    lVar6 = lVar7;
    trng::beta_dist<long_double>::pdf
              ((result_type_conflict3 *)d,(beta_dist<long_double> *)in_RSI,
               (result_type_conflict3)x_01);
    in_RSI = &catchAssertionHandler;
    std::vector<long_double,_std::allocator<long_double>_>::emplace_back<long_double>
              (&y,(longdouble *)&catchAssertionHandler);
    last._M_current = extraout_RDX_00;
  }
  simpson_int<__gnu_cxx::__normal_iterator<long_double*,std::vector<long_double,std::allocator<long_double>>>>
            ((value_type *)
             y.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
             super__Vector_impl_data._M_start,
             (__normal_iterator<long_double_*,_std::vector<long_double,_std::allocator<long_double>_>_>
              )y.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
               super__Vector_impl_data._M_finish,last);
  local_d8 = ((longdouble)64.0 / lVar3) / lVar3;
  local_68.super_ITransientExpression._vptr_ITransientExpression = (_func_int **)0x2602f7;
  local_68.super_ITransientExpression.m_isBinaryExpression = true;
  local_68.super_ITransientExpression.m_result = false;
  local_68.super_ITransientExpression._10_6_ = 0;
  local_e8.file =
       "/workspace/llm4binary/github/license_c_cmakelists/rabauke[P]trng4/tests/test_distributions.cc"
  ;
  local_e8.line._0_2_ = 0x94;
  local_e8.line._2_6_ = 0;
  Catch::StringRef::StringRef(&local_38,"std::abs(s - result_type(98) / result_type(100)) < tol");
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,(StringRef *)&local_68,&local_e8,local_38,Normal);
  lVar4 = ABS(_DAT_00261490 + in_ST3 * lVar5);
  local_e8.file = SUB108(lVar4,0);
  local_e8.line._0_2_ = (undefined2)((unkuint10)lVar4 >> 0x40);
  local_c0 = &local_e8;
  Catch::ExprLhs<long_double_const&>::operator<
            (&local_68,(ExprLhs<long_double_const&> *)&local_c0,&local_d8);
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_68.super_ITransientExpression);
  Catch::ITransientExpression::~ITransientExpression(&local_68.super_ITransientExpression);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  std::_Vector_base<long_double,_std::allocator<long_double>_>::~_Vector_base
            (&y.super__Vector_base<long_double,_std::allocator<long_double>_>);
  return;
}

Assistant:

void continuous_dist_test_integrate_pdf(const dist &d) {
  using result_type = typename dist::result_type;
  const int samples(static_cast<int>(std::min(
      1024ll * 1024, static_cast<long long>(std::round(
                         1 / std::sqrt(std::numeric_limits<result_type>::epsilon()))))));
  const result_type x_min{d.icdf(result_type(1) / result_type(100))};
  const result_type x_max{d.icdf(result_type(99) / result_type(100))};
  const result_type dx{(x_max - x_min) / samples};
  std::vector<result_type> y;
  for (int i{0}; i <= samples; ++i)
    y.push_back(d.pdf(x_min + i * dx));
  const result_type s{simpson_int(y.begin(), y.end()) * dx};
  const result_type tol{result_type(64) / result_type(samples) / result_type(samples)};
  REQUIRE(std::abs(s - result_type(98) / result_type(100)) < tol);
}